

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall jsonnet::internal::anon_unknown_0::Interpreter::joinStrings(Interpreter *this)

{
  char cVar1;
  uint idx;
  pointer pFVar2;
  HeapEntity *pHVar3;
  _func_int **pp_Var4;
  HeapEntity *context;
  AST *unaff_R14;
  Value VVar5;
  
  pFVar2 = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pHVar3 = pFVar2[-1].val2.v.h;
  do {
    idx = pFVar2[-1].elementId;
    pp_Var4 = pHVar3[1]._vptr_HeapEntity;
    if ((ulong)(*(long *)&pHVar3[1].mark - (long)pp_Var4 >> 3) <= (ulong)idx) {
      VVar5 = makeString(this,&pFVar2[-1].str);
      (this->scratch).t = STRING;
      (this->scratch).v = VVar5._0_8_;
      return (AST *)0x0;
    }
    context = (HeapEntity *)pp_Var4[idx];
    cVar1 = context->field_0xa;
    if (cVar1 == '\x01') {
      joinString(this,&pFVar2[-1].first,&pFVar2[-1].str,&pFVar2[-1].val,idx,(Value *)(context + 1));
      pFVar2[-1].elementId = pFVar2[-1].elementId + 1;
    }
    else {
      Stack::newCall(&this->stack,&pFVar2[-1].location,context,*(HeapObject **)&context[5].mark,
                     *(uint *)&context[6]._vptr_HeapEntity,(BindingFrame *)&context[2].mark);
      unaff_R14 = *(AST **)&context[6].mark;
    }
  } while (cVar1 != '\0');
  return unaff_R14;
}

Assistant:

const AST *joinStrings(void)
    {
        Frame &f = stack.top();
        const auto& elements = static_cast<HeapArray*>(f.val2.v.h)->elements;
        while (f.elementId < elements.size()) {
            auto *th = elements[f.elementId];
            if (th->filled) {
                joinString(f.first, f.str, f.val, f.elementId, th->content);
                f.elementId++;
            } else {
                stack.newCall(f.location, th, th->self, th->offset, th->upValues);
                return th->body;
            }
        }
        scratch = makeString(f.str);
        return nullptr;
    }